

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O1

void usage(void)

{
  fwrite("wrjpgcom inserts a textual comment in a JPEG file.\n",0x33,1,_stderr);
  fwrite("You can add to or replace any existing comment(s).\n",0x33,1,_stderr);
  fprintf(_stderr,"Usage: %s [switches] ",progname);
  fwrite("[inputfile]\n",0xc,1,_stderr);
  fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
  fwrite("  -replace         Delete any existing comments\n",0x30,1,_stderr);
  fwrite("  -comment \"text\"  Insert comment with given text\n",0x32,1,_stderr);
  fwrite("  -cfile name      Read comment from named file\n",0x30,1,_stderr);
  fwrite("Notice that you must put quotes around the comment text\n",0x38,1,_stderr);
  fwrite("when you use -comment.\n",0x17,1,_stderr);
  fwrite("If you do not give either -comment or -cfile on the command line,\n",0x42,1,_stderr);
  fwrite("then the comment text is read from standard input.\n",0x33,1,_stderr);
  fprintf(_stderr,"It can be multiple lines, up to %u characters total.\n",65000);
  fwrite("You must specify an input JPEG file name when supplying\n",0x38,1,_stderr);
  fwrite("comment text from standard input.\n",0x22,1,_stderr);
  exit(1);
}

Assistant:

static void
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "wrjpgcom inserts a textual comment in a JPEG file.\n");
  fprintf(stderr, "You can add to or replace any existing comment(s).\n");

  fprintf(stderr, "Usage: %s [switches] ", progname);
#ifdef TWO_FILE_COMMANDLINE
  fprintf(stderr, "inputfile outputfile\n");
#else
  fprintf(stderr, "[inputfile]\n");
#endif

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -replace         Delete any existing comments\n");
  fprintf(stderr, "  -comment \"text\"  Insert comment with given text\n");
  fprintf(stderr, "  -cfile name      Read comment from named file\n");
  fprintf(stderr, "Notice that you must put quotes around the comment text\n");
  fprintf(stderr, "when you use -comment.\n");
  fprintf(stderr, "If you do not give either -comment or -cfile on the command line,\n");
  fprintf(stderr, "then the comment text is read from standard input.\n");
  fprintf(stderr, "It can be multiple lines, up to %u characters total.\n",
          (unsigned int)MAX_COM_LENGTH);
#ifndef TWO_FILE_COMMANDLINE
  fprintf(stderr, "You must specify an input JPEG file name when supplying\n");
  fprintf(stderr, "comment text from standard input.\n");
#endif

  exit(EXIT_FAILURE);
}